

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O2

void __thiscall
TCLAP::CmdLine::parse
          (CmdLine *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  CmdLine *pCVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  CmdLineParseException *pCVar5;
  int iVar6;
  _List_node_base *p_Var7;
  allocator local_7a;
  allocator local_79;
  CmdLine *local_78;
  string local_70;
  string local_50;
  
  std::__cxx11::string::_M_assign((string *)&this->_progName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(args,(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
  local_70._M_dataplus._M_p._0_4_ = 0;
  iVar6 = 0;
  local_78 = this;
  do {
    pCVar1 = local_78;
    p_Var7 = (_List_node_base *)&this->_argList;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <=
        (ulong)(uint)local_70._M_dataplus._M_p) {
      iVar4 = local_78->_numRequired;
      if (iVar6 < iVar4) {
        missingArgsException(local_78);
        iVar4 = pCVar1->_numRequired;
      }
      if (iVar6 <= iVar4) {
        return;
      }
      pCVar5 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
      std::__cxx11::string::string((string *)&local_50,"Too many arguments!",&local_7a);
      std::__cxx11::string::string((string *)&local_70,"undefined",&local_79);
      CmdLineParseException::CmdLineParseException(pCVar5,&local_50,&local_70);
      __cxa_throw(pCVar5,&CmdLineParseException::typeinfo,ArgException::~ArgException);
    }
    do {
      p_Var7 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)&p_Var7->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var7 == (_List_node_base *)&this->_argList) {
        bVar3 = _emptyCombined(local_78,(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start +
                                        (int)(uint)local_70._M_dataplus._M_p);
        if ((!bVar3) && (Arg::ignoreRestRef()::ign == '\0')) {
          pCVar5 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
          std::__cxx11::string::string
                    ((string *)&local_50,"Couldn\'t find match for argument",&local_7a);
          CmdLineParseException::CmdLineParseException
                    (pCVar5,&local_50,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start +
                     (int)(uint)local_70._M_dataplus._M_p);
          __cxa_throw(pCVar5,&CmdLineParseException::typeinfo,ArgException::~ArgException);
        }
        goto LAB_0012eca0;
      }
      cVar2 = (**(code **)(*(long *)p_Var7[1]._M_next + 0x18))(p_Var7[1]._M_next,&local_70,args);
    } while (cVar2 == '\0');
    iVar4 = XorHandler::check(&this->_xorHandler,(Arg *)p_Var7[1]._M_next);
    iVar6 = iVar6 + iVar4;
LAB_0012eca0:
    local_70._M_dataplus._M_p._0_4_ = (uint)local_70._M_dataplus._M_p + 1;
  } while( true );
}

Assistant:

inline void CmdLine::parse(std::vector<std::string>& args)
{
	bool shouldExit = false;
	int estat = 0;

	try {
		_progName = args.front();
		args.erase(args.begin());

		int requiredCount = 0;

		for (int i = 0; static_cast<unsigned int>(i) < args.size(); i++) 
		{
			bool matched = false;
			for (ArgListIterator it = _argList.begin();
			     it != _argList.end(); it++) {
				if ( (*it)->processArg( &i, args ) )
				{
					requiredCount += _xorHandler.check( *it );
					matched = true;
					break;
				}
			}

			// checks to see if the argument is an empty combined
			// switch and if so, then we've actually matched it
			if ( !matched && _emptyCombined( args[i] ) )
				matched = true;

			if ( !matched && !Arg::ignoreRest() )
				throw(CmdLineParseException("Couldn't find match "
				                            "for argument",
				                            args[i]));
		}

		if ( requiredCount < _numRequired )
			missingArgsException();

		if ( requiredCount > _numRequired )
			throw(CmdLineParseException("Too many arguments!"));

	} catch ( ArgException& e ) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		try {
			_output->failure(*this,e);
		} catch ( ExitException &ee ) {
			estat = ee.getExitStatus();
			shouldExit = true;
		}
	} catch (ExitException &ee) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		estat = ee.getExitStatus();
		shouldExit = true;
	}

	if (shouldExit)
		exit(estat);
}